

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectArchive.hpp
# Opt level: O2

bool __thiscall
Diligent::DeviceObjectArchive::ResourceData::operator==(ResourceData *this,ResourceData *Other)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  
  bVar1 = SerializedData::operator!=(&this->Common,&Other->Common);
  if (bVar1) {
    bVar1 = false;
  }
  else {
    lVar3 = 0;
    do {
      bVar1 = lVar3 + 0x20 == 0x100;
      if (bVar1) {
        return bVar1;
      }
      bVar2 = SerializedData::operator!=
                        ((SerializedData *)(&(this->DeviceSpecific).field_0x0 + lVar3),
                         (SerializedData *)(&(Other->DeviceSpecific).field_0x0 + lVar3));
      lVar3 = lVar3 + 0x20;
    } while (!bVar2);
  }
  return bVar1;
}

Assistant:

bool operator==(const ResourceData& Other) const noexcept
        {
            if (Common != Other.Common)
                return false;

            for (size_t i = 0; i < DeviceSpecific.size(); ++i)
            {
                if (DeviceSpecific[i] != Other.DeviceSpecific[i])
                    return false;
            }

            return true;
        }